

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_xml_generator.cc
# Opt level: O1

void __thiscall t_xml_generator::generate_struct(t_xml_generator *this,t_struct *tstruct)

{
  long lVar1;
  int iVar2;
  undefined4 extraout_var;
  char *pcVar3;
  char *__end;
  pointer pptVar4;
  string tagname;
  vector<t_field_*,_std::allocator<t_field_*>_> members;
  undefined1 *local_120;
  char *local_118;
  undefined1 local_110 [16];
  t_struct *local_100;
  vector<t_field_*,_std::allocator<t_field_*>_> local_f8;
  string local_e0;
  string local_c0;
  string local_a0;
  string local_80;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_60;
  
  local_120 = local_110;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_120,"struct","");
  if (tstruct->is_union_ == false) {
    iVar2 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[0xc])(tstruct);
    if ((char)iVar2 == '\0') goto LAB_003676b3;
    pcVar3 = "exception";
  }
  else {
    pcVar3 = "union";
  }
  std::__cxx11::string::_M_replace((ulong)&local_120,0,local_118,(ulong)pcVar3);
LAB_003676b3:
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_80,local_120,local_118 + (long)local_120);
  write_element_start(this,&local_80);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p);
  }
  local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"name","");
  iVar2 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])(tstruct);
  lVar1 = *(long *)CONCAT44(extraout_var,iVar2);
  local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_c0,lVar1,((long *)CONCAT44(extraout_var,iVar2))[1] + lVar1);
  write_attribute(this,&local_a0,&local_c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p);
  }
  write_doc(this,(t_doc *)tstruct);
  local_100 = tstruct;
  std::vector<t_field_*,_std::allocator<t_field_*>_>::vector(&local_f8,&tstruct->members_);
  if (local_f8.super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_f8.super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pptVar4 = local_f8.super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    do {
      local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"field","");
      write_element_start(this,&local_e0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
        operator_delete(local_e0._M_dataplus._M_p);
      }
      generate_field(this,*pptVar4);
      write_element_end(this);
      pptVar4 = pptVar4 + 1;
    } while (pptVar4 !=
             local_f8.super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::_Rb_tree(&local_60,&(local_100->super_t_type).annotations_._M_t);
  generate_annotations
            (this,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)&local_60);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_60);
  write_element_end(this);
  if (local_f8.super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_f8.super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_120 != local_110) {
    operator_delete(local_120);
  }
  return;
}

Assistant:

void t_xml_generator::generate_struct(t_struct* tstruct) {

  string tagname = "struct";
  if (tstruct->is_union()) {
    tagname = "union";
  } else if (tstruct->is_xception()) {
    tagname = "exception";
  }

  write_element_start(tagname);
  write_attribute("name", tstruct->get_name());
  write_doc(tstruct);
  vector<t_field*> members = tstruct->get_members();
  vector<t_field*>::iterator mem_iter;
  for (mem_iter = members.begin(); mem_iter != members.end(); mem_iter++) {
    write_element_start("field");
    generate_field(*mem_iter);
    write_element_end();
  }

  generate_annotations(tstruct->annotations_);

  write_element_end();

}